

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O2

int gradient_clamp(gradient_data_t *gradient,int ipos)

{
  int iVar1;
  uint uVar2;
  
  if (gradient->spread == PLUTOVG_SPREAD_METHOD_REFLECT) {
    uVar2 = ipos & 0x7ff;
    if (0x3ff < uVar2) {
      uVar2 = uVar2 ^ 0x7ff;
    }
  }
  else if (gradient->spread == PLUTOVG_SPREAD_METHOD_REPEAT) {
    uVar2 = ipos & 0x3ff;
  }
  else {
    if (-1 < ipos) {
      iVar1 = 0x3ff;
      if ((uint)ipos < 0x3ff) {
        iVar1 = ipos;
      }
      return iVar1;
    }
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

static inline int gradient_clamp(const gradient_data_t* gradient, int ipos)
{
    if(gradient->spread == PLUTOVG_SPREAD_METHOD_REPEAT) {
        ipos = ipos % COLOR_TABLE_SIZE;
        ipos = ipos < 0 ? COLOR_TABLE_SIZE + ipos : ipos;
    } else if(gradient->spread == PLUTOVG_SPREAD_METHOD_REFLECT) {
        const int limit = COLOR_TABLE_SIZE * 2;
        ipos = ipos % limit;
        ipos = ipos < 0 ? limit + ipos : ipos;
        ipos = ipos >= COLOR_TABLE_SIZE ? limit - 1 - ipos : ipos;
    } else {
        if(ipos < 0) {
            ipos = 0;
        } else if(ipos >= COLOR_TABLE_SIZE) {
            ipos = COLOR_TABLE_SIZE - 1;
        }
    }

    return ipos;
}